

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O1

void EpdDivide(EpDouble *epd1,double value)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined8 in_XMM0_Qb;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = value;
  if ((SUB84(epd1->type,4) >> 0x14 < 0xfff ||
       ((ulong)epd1->type & 0xfffffffffffff) != 0x8000000000000) &&
     (((ulong)value & 0xfffffffffffff) != 0x8000000000000 || (ulong)value < 0xfff0000000000000)) {
    uVar3 = (ulong)epd1->type & 0x7fffffffffffffff;
    if (ABS(value) == INFINITY || uVar3 == 0x7ff0000000000000) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (ulong)value & 0x800fffffffffffff | 0x3ff0000000000000;
      auVar5 = auVar4;
      if (((ulong)value & 0x8008000000000000) == 0x8000000000000) {
        auVar5 = auVar6;
      }
      if (((ulong)value & 0x7ff7ffffffffffff) != 0x7ff0000000000000) {
        auVar5 = auVar6;
      }
      if (((ulong)value & 0x7ff0000000000000) != 0x3ff0000000000000) {
        auVar4 = auVar5;
      }
      if (uVar3 != 0x7ff0000000000000) {
        uVar1 = movmskpd(0,auVar4);
        epd1->type = (EpTypeUnion)(((ulong)uVar1 << 0x3f ^ (ulong)epd1->type) & 0x8000000000000000);
        goto LAB_0080fe7f;
      }
      if (ABS(value) != INFINITY) {
        uVar1 = movmskpd(0,auVar4);
        epd1->type = (EpTypeUnion)
                     (((ulong)uVar1 << 0x3f ^ (ulong)epd1->type) & 0x8000000000000000 |
                     0x7ff0000000000000);
        goto LAB_0080fe7f;
      }
    }
    else if ((value != 0.0) || (NAN(value))) {
      if (((ulong)epd1->type & 0x7ff0000000000000) != 0x3ff0000000000000) {
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                      ,0x1a0,"void EpdDivide(EpDouble *, double)");
      }
      iVar2 = 0;
      if ((((ulong)value & 0x7ff7ffffffffffff) != 0x7ff0000000000000 ||
           ((ulong)value & 0x8008000000000000) == 0x8000000000000) &&
         (uVar1 = (uint)((ulong)value >> 0x34) & 0x7ff, uVar1 != 0x3ff)) {
        iVar2 = uVar1 - 0x3ff;
        value = (double)((ulong)value & 0x800fffffffffffff | 0x3ff0000000000000);
      }
      (epd1->type).value = (epd1->type).value / value;
      epd1->exponent = epd1->exponent - iVar2;
      EpdNormalize(epd1);
      return;
    }
  }
  (epd1->type).value = -NAN;
LAB_0080fe7f:
  epd1->exponent = 0;
  return;
}

Assistant:

void
EpdDivide(EpDouble *epd1, double value)
{
  EpDouble      epd2;
  double        tmp;
  int           exponent;

  if (EpdIsNan(epd1) || IsNanDouble(value)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || IsInfDouble(value)) {
    int sign;

    EpdConvert(value, &epd2);
    if (EpdIsInf(epd1) && IsInfDouble(value)) {
      EpdMakeNan(epd1);
    } else if (EpdIsInf(epd1)) {
      sign = epd1->type.bits.sign ^ epd2.type.bits.sign;
      EpdMakeInf(epd1, sign);
    } else {
      sign = epd1->type.bits.sign ^ epd2.type.bits.sign;
      EpdMakeZero(epd1, sign);
    }
    return;
  }

  if (value == 0.0) {
    EpdMakeNan(epd1);
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);

  EpdConvert(value, &epd2);
  tmp = epd1->type.value / epd2.type.value;
  exponent = epd1->exponent - epd2.exponent;
  epd1->type.value = tmp;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}